

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void Am_Register_Support(Am_Value_Type type,Am_Type_Support *support)

{
  verify_support_table();
  OpenAmulet::Map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>_>::SetAt
            (Support_Table,type,support);
  return;
}

Assistant:

void
Am_Register_Support(Am_Value_Type type, Am_Type_Support *support)
{
  verify_support_table();
  Support_Table->SetAt(type, support);
}